

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

void ffcmps(char *templt,char *colname,int casesen,int *match,int *exact)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  ushort **ppuVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  char cVar16;
  char temp [71];
  char col [71];
  char local_c8 [70];
  undefined1 local_82;
  char local_78 [70];
  undefined1 local_32;
  
  *match = 0;
  *exact = 1;
  strncpy(local_c8,templt,0x47);
  strncpy(local_78,colname,0x47);
  local_82 = 0;
  local_32 = 0;
  sVar7 = strlen(local_c8);
  if (-1 < (int)sVar7 + -1) {
    do {
      uVar4 = (int)sVar7 - 1;
      sVar7 = (size_t)uVar4;
      if (local_c8[sVar7] != ' ') break;
      local_c8[sVar7] = '\0';
    } while (0 < (int)uVar4);
  }
  sVar7 = strlen(local_78);
  if (-1 < (int)sVar7 + -1) {
    do {
      uVar4 = (int)sVar7 - 1;
      sVar7 = (size_t)uVar4;
      if (local_78[sVar7] != ' ') break;
      local_78[sVar7] = '\0';
    } while (0 < (int)uVar4);
  }
  if (casesen == 0) {
    ffupch(local_c8);
    ffupch(local_78);
  }
  if ((local_c8[0] == local_78[0]) && (iVar5 = strcmp(local_c8,local_78), iVar5 == 0)) {
LAB_001347d4:
    *match = 1;
    return;
  }
  *exact = 0;
  uVar4 = 0;
  uVar13 = 0;
  bVar3 = false;
  uVar12 = 0;
  uVar6 = 0;
  do {
    uVar15 = (ulong)(int)uVar13;
    cVar1 = local_78[uVar15];
    if (local_c8[0] == '\0') {
      if (cVar1 == '\0') goto LAB_001347d4;
      if (!bVar3) {
        return;
      }
      local_c8[0] = local_c8[(int)uVar12];
      cVar1 = local_78[(long)(int)uVar6 + 1];
      uVar15 = (long)(int)uVar6 + 1;
      uVar13 = (uint)uVar15;
      uVar4 = uVar12;
    }
    else if (cVar1 == '\0') {
      if (local_c8[0] != '*') {
        return;
      }
      if (local_c8[(long)(int)uVar4 + 1] != '\0') {
        return;
      }
      goto LAB_001347d4;
    }
    if ((local_c8[0] == '?') || (local_c8[0] == cVar1)) {
      uVar13 = uVar13 + 1;
      uVar4 = uVar4 + 1;
    }
    else if (local_c8[0] == '*') {
      if ((local_c8[(long)(int)uVar4 + 1] & 0xdfU) == 0) goto LAB_001347d4;
      if (cVar1 == '\0') {
        return;
      }
      uVar10 = (long)(int)uVar4 + 1;
      pcVar11 = local_78 + uVar15 + 1;
      do {
        cVar16 = cVar1;
        cVar2 = local_c8[(int)uVar10];
        uVar9 = (int)uVar10 + (uint)(cVar2 == cVar16);
        uVar10 = (ulong)uVar9;
        cVar1 = *pcVar11;
        uVar14 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar14;
        if (cVar1 == '\0') break;
        pcVar11 = pcVar11 + 1;
      } while (cVar2 != cVar16);
      bVar3 = true;
      uVar12 = uVar4;
      uVar6 = uVar13;
      uVar4 = uVar9;
      uVar13 = uVar14;
      if (cVar2 != cVar16) {
        return;
      }
    }
    else {
      if (local_c8[0] == '#') {
        ppuVar8 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar8 + (long)cVar1 * 2 + 1) & 8) != 0) {
          pcVar11 = local_78 + uVar15 + 1;
          do {
            cVar1 = *pcVar11;
            uVar13 = (int)uVar15 + 1;
            uVar15 = (ulong)uVar13;
            pcVar11 = pcVar11 + 1;
          } while ((*(byte *)((long)*ppuVar8 + (long)cVar1 * 2 + 1) & 8) != 0);
          uVar4 = uVar4 + 1;
          goto LAB_00134723;
        }
      }
      if (!bVar3) {
        return;
      }
      uVar13 = uVar6 + 1;
      bVar3 = true;
      uVar4 = uVar12;
    }
LAB_00134723:
    local_c8[0] = local_c8[(int)uVar4];
  } while( true );
}

Assistant:

void ffcmps(char *templt,   /* I - input template (may have wildcards)      */
            char *colname,  /* I - full column name up to 68 + 1 chars long */
            int  casesen,   /* I - case sensitive string comparison? 1=yes  */
            int  *match,    /* O - do template and colname match? 1=yes     */
            int  *exact)    /* O - do strings exactly match, or wildcards   */
/*
  compare the template to the string and test if they match.
  The strings are limited to 68 characters or less (the max. length
  of a FITS string keyword value.  This routine reports whether
  the two strings match and whether the match is exact or
  involves wildcards.

  This algorithm is very similar to the way unix filename wildcards
  work except that this first treats a wild card as a literal character
  when looking for a match.  If there is no literal match, then
  it interpretes it as a wild card.  So the template 'AB*DE'
  is considered to be an exact rather than a wild card match to
  the string 'AB*DE'.  The '#' wild card in the template string will 
  match any consecutive string of decimal digits in the colname.
  
*/
{
    int ii, found, t1, s1, wildsearch = 0, tsave = 0, ssave = 0;
    char temp[FLEN_VALUE], col[FLEN_VALUE];

    *match = FALSE;
    *exact = TRUE;

    strncpy(temp, templt, FLEN_VALUE); /* copy strings to work area */
    strncpy(col, colname, FLEN_VALUE);
    temp[FLEN_VALUE - 1] = '\0';  /* make sure strings are terminated */
    col[FLEN_VALUE - 1]  = '\0';

    /* truncate trailing non-significant blanks */
    for (ii = strlen(temp) - 1; ii >= 0 && temp[ii] == ' '; ii--)
        temp[ii] = '\0';

    for (ii = strlen(col) - 1; ii >= 0 && col[ii] == ' '; ii--)
        col[ii] = '\0';
       
    if (!casesen)
    {             /* convert both strings to uppercase before comparison */
        ffupch(temp);
        ffupch(col);
    }

    if (!FSTRCMP(temp, col) )
    {
        *match = TRUE;     /* strings exactly match */
        return;
    }

    *exact = FALSE;    /* strings don't exactly match */

    t1 = 0;   /* start comparison with 1st char of each string */
    s1 = 0;

    while(1)  /* compare corresponding chars in each string */
    {
      if (temp[t1] == '\0' && col[s1] == '\0')
      { 
         /* completely scanned both strings so they match */
         *match = TRUE;
         return;
      }
      else if (temp[t1] == '\0')
      { 
        if (wildsearch)
        {
            /* 
               the previous wildcard search may have been going down
               a blind alley.  Backtrack, and resume the wildcard
               search with the next character in the string.
            */
            t1 = tsave;
            s1 = ssave + 1;
        }
        else
        {
            /* reached end of template string so they don't match */
            return;
        }
      }
      else if (col[s1] == '\0')
      { 
         /* reached end of other string; they match if the next */
         /* character in the template string is a '*' wild card */

        if (temp[t1] == '*' && temp[t1 + 1] == '\0')
        {
           *match = TRUE;
        }

        return;
      }

      if (temp[t1] == col[s1] || (temp[t1] == '?') )
      {
        s1++;  /* corresponding chars in the 2 strings match */
        t1++;  /* increment both pointers and loop back again */
      }
      else if (temp[t1] == '#' && isdigit((int) col[s1]) )
      {
        s1++;  /* corresponding chars in the 2 strings match */
        t1++;  /* increment both pointers */

        /* find the end of the string of digits */
        while (isdigit((int) col[s1]) ) 
            s1++;        
      }
      else if (temp[t1] == '*')
      {

        /* save current string locations, in case we need to restart */
        wildsearch = 1;
        tsave = t1;
        ssave = s1;

        /* get next char from template and look for it in the col name */
        t1++;
        if (temp[t1] == '\0' || temp[t1] == ' ')
        {
          /* reached end of template so strings match */
          *match = TRUE;
          return;
        }

        found = FALSE;
        while (col[s1] && !found)
        {
          if (temp[t1] == col[s1])
          {
            t1++;  /* found matching characters; incre both pointers */
            s1++;  /* and loop back to compare next chars */
            found = TRUE;
          }
          else
            s1++;  /* increment the column name pointer and try again */
        }

        if (!found)
        {
          return;  /* hit end of column name and failed to find a match */
        }
      }
      else
      {
        if (wildsearch)
        {
            /* 
               the previous wildcard search may have been going down
               a blind alley.  Backtrack, and resume the wildcard
               search with the next character in the string.
            */
            t1 = tsave;
            s1 = ssave + 1;
        }
        else
        {
          return;   /* strings don't match */
        }
      }
    }
}